

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void utilOnExitInit(void)

{
  bool_t bVar1;
  int iVar2;
  
  bVar1 = mtMtxCreate((mt_mtx_t *)0x12c2bd);
  if (bVar1 != 0) {
    iVar2 = atexit(utilOnExitRun);
    if (iVar2 == 0) {
      _inited = 1;
    }
    else {
      mtMtxClose((mt_mtx_t *)0x12c2e1);
    }
  }
  return;
}

Assistant:

static void utilOnExitInit()
{
	// создать мьютекс
	if (!mtMtxCreate(_mtx))
		return;
	// зарегистрировать обработчик
	if (atexit(utilOnExitRun) != 0)
	{
		mtMtxClose(_mtx);
		return;
	}
	_inited = TRUE;
}